

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfile.c
# Opt level: O2

pboolean p_file_remove(pchar *file,PError **error)

{
  int iVar1;
  PErrorIO code;
  pint native_code;
  pboolean pVar2;
  
  if (file == (pchar *)0x0) {
    pVar2 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    iVar1 = unlink(file);
    if (iVar1 == 0) {
      pVar2 = 1;
    }
    else {
      code = p_error_get_last_io();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to remove file");
      pVar2 = 0;
    }
  }
  return pVar2;
}

Assistant:

P_LIB_API pboolean
p_file_remove (const pchar	*file,
	       PError		**error)
{
	pboolean result;

	if (P_UNLIKELY (file == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

#ifdef P_OS_WIN
	result = (DeleteFileA ((LPCSTR) file) != 0);
#else
	result = (unlink (file) == 0);
#endif

	if (P_UNLIKELY (!result))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to remove file");

	return result;
}